

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O0

Vec_Wec_t * Abc_NtkFxRetrieve(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  uint Entry;
  Vec_Wec_t *p;
  Abc_Obj_t *pObj;
  Vec_Int_t *p_00;
  int *piVar3;
  bool bVar4;
  int local_48;
  int local_44;
  int Lit;
  int v;
  int i;
  int nVars;
  char *pSop;
  char *pCube;
  Abc_Obj_t *pNode;
  Vec_Int_t *vCube;
  Vec_Wec_t *vCubes;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsSopLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                  ,0x91,"Vec_Wec_t *Abc_NtkFxRetrieve(Abc_Ntk_t *)");
  }
  p = Vec_WecAlloc(1000);
  Lit = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vObjs);
    if (iVar1 <= Lit) {
      return p;
    }
    pObj = Abc_NtkObj(pNtk,Lit);
    if ((pObj != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj), iVar1 != 0)) {
      pSop = (char *)(pObj->field_5).pData;
      iVar1 = Abc_SopGetVarNum(pSop);
      iVar2 = Abc_ObjFaninNum(pObj);
      if (iVar1 != iVar2) {
        __assert_fail("nVars == Abc_ObjFaninNum(pNode)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                      ,0x97,"Vec_Wec_t *Abc_NtkFxRetrieve(Abc_Ntk_t *)");
      }
      for (; *pSop != '\0'; pSop = pSop + (iVar1 + 3)) {
        p_00 = Vec_WecPushLevel(p);
        Entry = Abc_ObjId(pObj);
        Vec_IntPush(p_00,Entry);
        local_44 = 0;
        while( true ) {
          bVar4 = false;
          if (pSop[local_44] != ' ') {
            local_48 = (int)pSop[local_44];
            bVar4 = local_48 != 0;
          }
          if (!bVar4) break;
          if (local_48 == 0x30) {
            iVar2 = Abc_ObjFaninId(pObj,local_44);
            iVar2 = Abc_Var2Lit(iVar2,1);
            Vec_IntPush(p_00,iVar2);
          }
          else if (local_48 == 0x31) {
            iVar2 = Abc_ObjFaninId(pObj,local_44);
            iVar2 = Abc_Var2Lit(iVar2,0);
            Vec_IntPush(p_00,iVar2);
          }
          local_44 = local_44 + 1;
        }
        piVar3 = Vec_IntArray(p_00);
        iVar2 = Vec_IntSize(p_00);
        Vec_IntSelectSort(piVar3 + 1,iVar2 + -1);
      }
    }
    Lit = Lit + 1;
  } while( true );
}

Assistant:

Vec_Wec_t * Abc_NtkFxRetrieve( Abc_Ntk_t * pNtk )
{
    Vec_Wec_t * vCubes;
    Vec_Int_t * vCube;
    Abc_Obj_t * pNode;
    char * pCube, * pSop;
    int nVars, i, v, Lit;
    assert( Abc_NtkIsSopLogic(pNtk) );
    vCubes = Vec_WecAlloc( 1000 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        pSop = (char *)pNode->pData;
        nVars = Abc_SopGetVarNum(pSop);
        assert( nVars == Abc_ObjFaninNum(pNode) );
//        if ( nVars < 2 ) continue;
        Abc_SopForEachCube( pSop, nVars, pCube )
        {
            vCube = Vec_WecPushLevel( vCubes );
            Vec_IntPush( vCube, Abc_ObjId(pNode) );
            Abc_CubeForEachVar( pCube, Lit, v )
            {
                if ( Lit == '0' )
                    Vec_IntPush( vCube, Abc_Var2Lit(Abc_ObjFaninId(pNode, v), 1) );
                else if ( Lit == '1' )
                    Vec_IntPush( vCube, Abc_Var2Lit(Abc_ObjFaninId(pNode, v), 0) );
            }
            Vec_IntSelectSort( Vec_IntArray(vCube) + 1, Vec_IntSize(vCube) - 1 );
        }
    }
    return vCubes;
}